

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

Abc_Ntk_t *
Abc_SclBufPerform(Abc_Ntk_t *pNtk,int FanMin,int FanMax,int fBufPis,int fSkipDup,int fVerbose)

{
  int iPivot;
  int iVar1;
  int v;
  Vec_Que_t *p;
  int *piVar2;
  int *piVar3;
  Buf_Man_t *p_00;
  Abc_Ntk_t *p_01;
  int iVar4;
  bool bVar5;
  
  p_00 = Buf_ManStart(pNtk,FanMin,FanMax,fBufPis);
  Abc_NtkLevel(pNtk);
  iVar4 = 1000000000;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    p = p_00->vQue;
    if (p->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x88,"int Vec_QueSize(Vec_Que_t *)");
    }
    if (p->nSize == 1) break;
    piVar2 = p->pHeap;
    piVar3 = p->pOrder;
    iPivot = piVar2[1];
    piVar3[iPivot] = -1;
    iVar1 = p->nSize;
    p->nSize = iVar1 + -1;
    if (iVar1 + -1 == 1) {
      piVar2[1] = -1;
    }
    else {
      v = piVar2[(long)iVar1 + -1];
      piVar2[(long)iVar1 + -1] = -1;
      piVar2[1] = v;
      piVar3[v] = 1;
      Vec_QueMoveDown(p,v);
    }
    Abc_BufPerformOne(p_00,iPivot,fSkipDup,fVerbose);
  }
  Buf_ManStop(p_00);
  p_01 = Abc_NtkDupDfs(pNtk);
  Abc_SclCheckNtk(p_01,fVerbose);
  return p_01;
}

Assistant:

Abc_Ntk_t * Abc_SclBufPerform( Abc_Ntk_t * pNtk, int FanMin, int FanMax, int fBufPis, int fSkipDup, int fVerbose )
{
    Abc_Ntk_t * pNew;
    Buf_Man_t * p = Buf_ManStart( pNtk, FanMin, FanMax, fBufPis );
    int i, Limit = ABC_INFINITY;
    Abc_NtkLevel( pNtk );
//    if ( Abc_NtkNodeNum(pNtk) < 1000 )
//        fSkipDup = 1;
    for ( i = 0; i < Limit && Vec_QueSize(p->vQue); i++ )
        Abc_BufPerformOne( p, Vec_QuePop(p->vQue), fSkipDup, fVerbose );
    Buf_ManStop( p );
//    Abc_BufReplaceBufsByInvs( pNtk );
    // duplicate network in topo order
    pNew = Abc_NtkDupDfs( pNtk );
    Abc_SclCheckNtk( pNew, fVerbose );
    return pNew;
}